

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

void Ivy_ManHaigSimulate(Ivy_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *p_00;
  int iVar3;
  Ivy_Init_t IVar4;
  Ivy_Init_t In1_00;
  Ivy_Obj_t *pIVar5;
  bool bVar6;
  uint local_4c;
  int fVerbose;
  int Counter;
  int k;
  int i;
  Ivy_Init_t In1;
  Ivy_Init_t In0;
  Ivy_Obj_t *pTemp;
  Ivy_Obj_t *pObj;
  Vec_Int_t *vLatchesD;
  Vec_Int_t *vLatches;
  Vec_Int_t *vNodes;
  Ivy_Man_t *p_local;
  
  vNodes = (Vec_Int_t *)p;
  Ivy_ManCheckChoices(p);
  if (vNodes[0xd].pArray == (int *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                  ,0x1c4,"void Ivy_ManHaigSimulate(Ivy_Man_t *)");
  }
  vNodes = (Vec_Int_t *)vNodes[0xd].pArray;
  vLatches = Ivy_ManDfsSeq((Ivy_Man_t *)vNodes,&vLatchesD);
  pIVar5 = Ivy_ManConst1((Ivy_Man_t *)vNodes);
  *(uint *)&pIVar5->field_0x8 = *(uint *)&pIVar5->field_0x8 & 0xfffff9ff | 0x400;
  for (Counter = 0; iVar3 = Vec_PtrSize(*(Vec_Ptr_t **)vNodes), Counter < iVar3;
      Counter = Counter + 1) {
    pTemp = (Ivy_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)vNodes,Counter);
    *(uint *)&pTemp->field_0x8 = *(uint *)&pTemp->field_0x8 & 0xfffff9ff | 0x200;
  }
  Counter = 0;
  while( true ) {
    iVar3 = Vec_IntSize(vLatchesD);
    pVVar2 = vNodes;
    bVar6 = false;
    if (Counter < iVar3) {
      iVar3 = Vec_IntEntry(vLatchesD,Counter);
      pTemp = Ivy_ManObj((Ivy_Man_t *)pVVar2,iVar3);
      bVar6 = pTemp != (Ivy_Obj_t *)0x0;
    }
    if (!bVar6) break;
    *(uint *)&pTemp->field_0x8 = *(uint *)&pTemp->field_0x8 & 0xfffff9ff | 0x600;
    Counter = Counter + 1;
  }
  pVVar2 = (Vec_Int_t *)vNodes[0xc].pArray;
  Counter = 0;
  while( true ) {
    iVar3 = Vec_IntSize(pVVar2);
    p_00 = vNodes;
    bVar6 = false;
    if (Counter < iVar3) {
      iVar3 = Vec_IntEntry(pVVar2,Counter);
      pTemp = Ivy_ManObj((Ivy_Man_t *)p_00,iVar3);
      bVar6 = pTemp != (Ivy_Obj_t *)0x0;
    }
    if (!bVar6) break;
    *(uint *)&pTemp->field_0x8 = *(uint *)&pTemp->field_0x8 & 0xfffff9ff | 0x200;
    Counter = Counter + 1;
  }
  fVerbose = 0;
  do {
    if (9 < fVerbose) {
      Vec_IntFree(vLatches);
      Vec_IntFree(vLatchesD);
      return;
    }
    local_4c = 0;
    Counter = 0;
    while( true ) {
      iVar3 = Vec_IntSize(vLatchesD);
      pVVar2 = vNodes;
      bVar6 = false;
      if (Counter < iVar3) {
        iVar3 = Vec_IntEntry(vLatchesD,Counter);
        pTemp = Ivy_ManObj((Ivy_Man_t *)pVVar2,iVar3);
        bVar6 = pTemp != (Ivy_Obj_t *)0x0;
      }
      if (!bVar6) break;
      local_4c = ((*(uint *)&pTemp->field_0x8 >> 9 & 3) == 3) + local_4c;
      Counter = Counter + 1;
    }
    printf("Iter %d : Non-determinate = %d\n",(ulong)(uint)fVerbose,(ulong)local_4c);
    Counter = 0;
    while( true ) {
      iVar3 = Vec_IntSize(vLatches);
      pVVar2 = vNodes;
      bVar6 = false;
      if (Counter < iVar3) {
        iVar3 = Vec_IntEntry(vLatches,Counter);
        pTemp = Ivy_ManObj((Ivy_Man_t *)pVVar2,iVar3);
        bVar6 = pTemp != (Ivy_Obj_t *)0x0;
      }
      if (!bVar6) break;
      pIVar5 = Ivy_ObjFanin0(pTemp);
      uVar1 = *(uint *)&pIVar5->field_0x8;
      iVar3 = Ivy_ObjFaninC0(pTemp);
      IVar4 = Ivy_InitNotCond(uVar1 >> 9 & IVY_INIT_DC,iVar3);
      pIVar5 = Ivy_ObjFanin1(pTemp);
      uVar1 = *(uint *)&pIVar5->field_0x8;
      iVar3 = Ivy_ObjFaninC1(pTemp);
      In1_00 = Ivy_InitNotCond(uVar1 >> 9 & IVY_INIT_DC,iVar3);
      IVar4 = Ivy_ManHaigSimulateAnd(IVar4,In1_00);
      *(Ivy_Init_t *)&pTemp->field_0x8 =
           *(uint *)&pTemp->field_0x8 & 0xfffff9ff | (IVar4 & IVY_INIT_DC) << 9;
      if ((pTemp->pEquiv != (Ivy_Obj_t *)0x0) && (iVar3 = Ivy_ObjRefs(pTemp), 0 < iVar3)) {
        i = *(uint *)&pTemp->field_0x8 >> 9 & 3;
        iVar3 = Ivy_IsComplement(pTemp->pEquiv);
        if (iVar3 != 0) {
          __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                        ,0x1f6,"void Ivy_ManHaigSimulate(Ivy_Man_t *)");
        }
        for (_In1 = pTemp->pEquiv; _In1 != pTemp; _In1 = Ivy_Regular(_In1->pEquiv)) {
          uVar1 = *(uint *)&_In1->field_0x8;
          iVar3 = Ivy_IsComplement(_In1->pEquiv);
          IVar4 = Ivy_InitNotCond(uVar1 >> 9 & IVY_INIT_DC,iVar3);
          i = Ivy_ManHaigSimulateChoice(i,IVar4);
        }
        *(uint *)&pTemp->field_0x8 = *(uint *)&pTemp->field_0x8 & 0xfffff9ff | (i & 3U) << 9;
      }
      Counter = Counter + 1;
    }
    Counter = 0;
    while( true ) {
      iVar3 = Vec_IntSize(vLatchesD);
      pVVar2 = vNodes;
      bVar6 = false;
      if (Counter < iVar3) {
        iVar3 = Vec_IntEntry(vLatchesD,Counter);
        pTemp = Ivy_ManObj((Ivy_Man_t *)pVVar2,iVar3);
        bVar6 = pTemp != (Ivy_Obj_t *)0x0;
      }
      if (!bVar6) break;
      pIVar5 = Ivy_ObjFanin0(pTemp);
      *(uint *)&pTemp->field_0x8 =
           *(uint *)&pTemp->field_0x8 & 0x7ff | (*(uint *)&pIVar5->field_0x8 >> 9 & 3) << 0xb;
      Counter = Counter + 1;
    }
    Counter = 0;
    while( true ) {
      iVar3 = Vec_IntSize(vLatchesD);
      pVVar2 = vNodes;
      bVar6 = false;
      if (Counter < iVar3) {
        iVar3 = Vec_IntEntry(vLatchesD,Counter);
        pTemp = Ivy_ManObj((Ivy_Man_t *)pVVar2,iVar3);
        bVar6 = pTemp != (Ivy_Obj_t *)0x0;
      }
      if (!bVar6) break;
      *(uint *)&pTemp->field_0x8 =
           *(uint *)&pTemp->field_0x8 & 0xfffff9ff | (*(uint *)&pTemp->field_0x8 >> 0xb & 3) << 9;
      *(uint *)&pTemp->field_0x8 = *(uint *)&pTemp->field_0x8 & 0x7ff;
      Counter = Counter + 1;
    }
    fVerbose = fVerbose + 1;
  } while( true );
}

Assistant:

void Ivy_ManHaigSimulate( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes, * vLatches, * vLatchesD;
    Ivy_Obj_t * pObj, * pTemp;
    Ivy_Init_t In0, In1;
    int i, k, Counter;
    int fVerbose = 0;

    // check choices
    Ivy_ManCheckChoices( p );

    // switch to HAIG
    assert( p->pHaig != NULL );
    p = p->pHaig;

if ( fVerbose )
Ivy_ManForEachPi( p, pObj, i )
printf( "Setting PI %d\n", pObj->Id );

    // collect latches and nodes in the DFS order
    vNodes = Ivy_ManDfsSeq( p, &vLatches );

if ( fVerbose )
Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
printf( "Collected node %d with fanins %d and %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id );

    // set the PI values
    Ivy_ManConst1(p)->Init = IVY_INIT_1;
    Ivy_ManForEachPi( p, pObj, i )
        pObj->Init = IVY_INIT_0;

    // set the latch values
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        pObj->Init = IVY_INIT_DC;
    // set the latches of D to be determinate
    vLatchesD = (Vec_Int_t *)p->pData;
    Ivy_ManForEachNodeVec( p, vLatchesD, pObj, i )
        pObj->Init = IVY_INIT_0;

    // perform several rounds of simulation
    for ( k = 0; k < 10; k++ )
    {
        // count the number of non-determinate values
        Counter = 0;
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
            Counter += ( pObj->Init == IVY_INIT_DC );
        printf( "Iter %d : Non-determinate = %d\n", k, Counter );    
        
        // simulate the internal nodes
        Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
        {
if ( fVerbose )
printf( "Processing node %d with fanins %d and %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id );
            In0 = Ivy_InitNotCond( (Ivy_Init_t)Ivy_ObjFanin0(pObj)->Init, Ivy_ObjFaninC0(pObj) );
            In1 = Ivy_InitNotCond( (Ivy_Init_t)Ivy_ObjFanin1(pObj)->Init, Ivy_ObjFaninC1(pObj) );
            pObj->Init = Ivy_ManHaigSimulateAnd( In0, In1 );
            // simulate the equivalence class if the node is a representative
            if ( pObj->pEquiv && Ivy_ObjRefs(pObj) > 0 )
            {
if ( fVerbose )
printf( "Processing choice node %d\n", pObj->Id );
                In0 = (Ivy_Init_t)pObj->Init;
                assert( !Ivy_IsComplement(pObj->pEquiv) );
                for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
                {
if ( fVerbose )
printf( "Processing secondary node %d\n", pTemp->Id );
                    In1 = Ivy_InitNotCond( (Ivy_Init_t)pTemp->Init, Ivy_IsComplement(pTemp->pEquiv) );
                    In0 = Ivy_ManHaigSimulateChoice( In0, In1 );
                }
                pObj->Init = In0;
            }
        }

        // simulate the latches
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        {
            pObj->Level = Ivy_ObjFanin0(pObj)->Init;
if ( fVerbose )
printf( "Using latch %d with fanin %d\n", pObj->Id, Ivy_ObjFanin0(pObj)->Id );
        }
        Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
            pObj->Init = pObj->Level, pObj->Level = 0;
    }
    // free arrays
    Vec_IntFree( vNodes );
    Vec_IntFree( vLatches );
}